

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::schema::Node::Reader> * __thiscall
capnp::compiler::Compiler::Node::resolveFinalSchema
          (Maybe<capnp::schema::Node::Reader> *__return_storage_ptr__,Node *this,uint64_t id)

{
  Fault f;
  LazyLoadCallback local_18;
  
  Compiler::Impl::findNode((Impl *)&stack0xffffffffffffffe8,(uint64_t)this->module->compiler);
  if ((Node *)local_18._vptr_LazyLoadCallback != (Node *)0x0) {
    getFinalSchema(__return_storage_ptr__,(Node *)local_18._vptr_LazyLoadCallback);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            ((Fault *)&stack0xffffffffffffffe8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x3c2,FAILED,(char *)0x0,"\"Tried to get schema for ID we haven\'t seen before.\"",
             (char (*) [51])"Tried to get schema for ID we haven\'t seen before.");
  kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffe8);
}

Assistant:

kj::Maybe<schema::Node::Reader> Compiler::Node::resolveFinalSchema(uint64_t id) {
  KJ_IF_SOME(node, module->getCompiler().findNode(id)) {
    return node.getFinalSchema();
  } else {
    KJ_FAIL_REQUIRE("Tried to get schema for ID we haven't seen before.");
  }
}